

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iffl_allocator.h
# Opt level: O0

void __thiscall iffl::debug_memory_resource::decrement_busy_block_count(debug_memory_resource *this)

{
  __int_type _Var1;
  atomic<unsigned_long> *paVar2;
  size_t prev_busy_blocks_count;
  debug_memory_resource *this_local;
  
  paVar2 = &this->busy_blocks_count_;
  LOCK();
  _Var1 = (paVar2->super___atomic_base<unsigned_long>)._M_i;
  (paVar2->super___atomic_base<unsigned_long>)._M_i =
       (paVar2->super___atomic_base<unsigned_long>)._M_i - 1;
  UNLOCK();
  if (_Var1 == 0) {
    std::terminate();
  }
  return;
}

Assistant:

void decrement_busy_block_count() noexcept {
        size_t const prev_busy_blocks_count = busy_blocks_count_.fetch_sub(1, std::memory_order_relaxed);
        FFL_CODDING_ERROR_IF_NOT(prev_busy_blocks_count > 0);
    }